

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncharutils.h
# Opt level: O0

size_t codepoint_to_utf8(uint32_t cp,uint8_t *c)

{
  byte bVar1;
  uint8_t *c_local;
  uint32_t cp_local;
  size_t local_8;
  
  bVar1 = (byte)cp;
  if (cp < 0x80) {
    *c = bVar1;
    local_8 = 1;
  }
  else if (cp < 0x800) {
    *c = (char)(cp >> 6) + 0xc0;
    c[1] = (bVar1 & 0x3f) + 0x80;
    local_8 = 2;
  }
  else if (cp < 0x10000) {
    *c = (char)(cp >> 0xc) + 0xe0;
    c[1] = ((byte)(cp >> 6) & 0x3f) + 0x80;
    c[2] = (bVar1 & 0x3f) + 0x80;
    local_8 = 3;
  }
  else if (cp < 0x110000) {
    *c = (char)(cp >> 0x12) + 0xf0;
    c[1] = ((byte)(cp >> 0xc) & 0x3f) + 0x80;
    c[2] = ((byte)(cp >> 6) & 0x3f) + 0x80;
    c[3] = (bVar1 & 0x3f) + 0x80;
    local_8 = 4;
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

inline size_t codepoint_to_utf8(uint32_t cp, uint8_t *c) {
  if (cp <= 0x7F) {
    c[0] = cp;
    return 1; // ascii
  } if (cp <= 0x7FF) {
    c[0] = (cp >> 6) + 192;
    c[1] = (cp & 63) + 128;
    return 2; // universal plane
  //  Surrogates are treated elsewhere...
  //} //else if (0xd800 <= cp && cp <= 0xdfff) {
  //  return 0; // surrogates // could put assert here
  } else if (cp <= 0xFFFF) {
    c[0] = (cp >> 12) + 224;
    c[1] = ((cp >> 6) & 63) + 128;
    c[2] = (cp & 63) + 128;
    return 3;
  } else if (cp <= 0x10FFFF) { // if you know you have a valid code point, this is not needed
    c[0] = (cp >> 18) + 240;
    c[1] = ((cp >> 12) & 63) + 128;
    c[2] = ((cp >> 6) & 63) + 128;
    c[3] = (cp & 63) + 128;
    return 4;
  }
  // will return 0 when the code point was too large.
  return 0; // bad r
}